

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::UnmapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  USAGE UVar1;
  pointer pMVar2;
  BufferVkImpl *pBuffVk;
  undefined7 in_register_00000011;
  int iVar3;
  char (*in_R8) [34];
  ulong uVar4;
  BufferDesc *Args;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType);
  pBuffVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  iVar3 = (int)CONCAT71(in_register_00000011,MapType);
  if (iVar3 == 2) {
    UVar1 = (pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Usage;
    if (UVar1 - 3 < 2) {
      if (((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties &
          MEMORY_PROPERTY_HOST_COHERENT) == MEMORY_PROPERTY_UNKNOWN) {
        BufferVkImpl::FlushMappedRange
                  (pBuffVk,0,
                   (pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.Size);
        return;
      }
    }
    else if ((UVar1 == USAGE_DYNAMIC) && ((pBuffVk->m_VulkanBuffer).m_VkObject != (VkBuffer_T *)0x0)
            ) {
      Args = &(pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc;
      uVar4 = (ulong)(pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
      if (uVar4 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' does not have dynamic buffer ID",in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8de);
        std::__cxx11::string::~string((string *)&msg);
      }
      pMVar2 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar4 < (ulong)(((long)(this->m_MappedBuffers).
                                 super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x28))
      {
        UpdateBufferRegion(this,pBuffVk,0,
                           (pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           .m_Desc.Size,
                           *(VkBuffer_T **)
                            ((long)&(pMVar2[uVar4].Allocation.pDynamicMemMgr)->m_VkBuffer + 0x10),
                           pMVar2[uVar4].Allocation.AlignedOffset,
                           RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
      }
      else {
        FormatString<char[19],char_const*,char[34]>
                  (&msg,(Diligent *)"Unmapping buffer \'",(char (*) [19])Args,
                   (char **)"\' that was not previously mapped.",in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8e7);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
  else if (((iVar3 == 1) &&
           ((byte)((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.Usage - USAGE_STAGING) < 2)) &&
          (((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties &
           MEMORY_PROPERTY_HOST_COHERENT) == MEMORY_PROPERTY_UNKNOWN)) {
    BufferVkImpl::InvalidateMappedRange
              (pBuffVk,0,
               (pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.Size);
    return;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    TDeviceContextBase::UnmapBuffer(pBuffer, MapType);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->InvalidateMappedRange(0, BuffDesc.Size);
            }
        }
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->FlushMappedRange(0, BuffDesc.Size);
            }
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
            {
                const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
                VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
                if (DynamicBufferId < m_MappedBuffers.size())
                {
                    VulkanDynamicAllocation& DynAlloc  = m_MappedBuffers[DynamicBufferId].Allocation;
                    VkBuffer                 vkSrcBuff = DynAlloc.pDynamicMemMgr->GetVkBuffer();
                    UpdateBufferRegion(pBufferVk, 0, BuffDesc.Size, vkSrcBuff, DynAlloc.AlignedOffset, RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
                }
                else
                {
                    DEV_ERROR("Unmapping buffer '", BuffDesc.Name, "' that was not previously mapped.");
                }
            }
        }
    }
}